

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O3

void __thiscall S98Player::ParseFile(S98Player *this,UINT32 ticks)

{
  uint uVar1;
  
  uVar1 = ticks + this->_playTick;
  this->_playTick = uVar1;
  if (((this->_playState & 2) == 0) && (this->_fileTick <= uVar1)) {
    do {
      if ((this->_playState & 2) != 0) {
        return;
      }
      DoCommand(this);
    } while (this->_fileTick <= this->_playTick);
  }
  return;
}

Assistant:

void S98Player::ParseFile(UINT32 ticks)
{
	_playTick += ticks;
	if (_playState & PLAYSTATE_END)
		return;
	
	while(_fileTick <= _playTick && ! (_playState & PLAYSTATE_END))
		DoCommand();
	
	return;
}